

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O0

object * borg_get_top_object(chunk *c,loc_conflict grid)

{
  object *local_20;
  object *o_ptr;
  chunk *c_local;
  loc_conflict grid_local;
  
  local_20 = square_object((chunk *)cave,grid);
  while( true ) {
    while( true ) {
      if (local_20 == (object *)0x0) {
        return (object *)0x0;
      }
      if ((local_20->known == (object *)0x0) || ((local_20->known->notice & 4) == 0)) break;
      local_20 = local_20->next;
    }
    if (local_20->kind->ignore == '\0') break;
    local_20 = local_20->next;
  }
  return local_20;
}

Assistant:

struct object * borg_get_top_object(struct chunk *c, struct loc grid)
{
    /* Cheat the Actual item */
    struct object *o_ptr;
    o_ptr = square_object(cave, grid);
    while (o_ptr) {
        if ((o_ptr->known && o_ptr->known->notice & OBJ_NOTICE_IGNORE))
            o_ptr = o_ptr->next;
        else if (o_ptr->kind->ignore)
            o_ptr = o_ptr->next;
        else
            break;
    }

    return o_ptr;
}